

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O1

void loadable_extension_demo_init(DatabaseInstance *db)

{
  pointer pcVar1;
  char *pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ScalarFunction SVar4;
  ScalarFunction SVar5;
  ScalarFunction SVar6;
  ScalarFunction SVar7;
  ScalarFunction SVar8;
  ScalarFunction SVar9;
  ScalarFunction SVar10;
  ScalarFunction SVar11;
  ScalarFunction SVar12;
  ScalarFunction SVar13;
  TableFunction TVar14;
  undefined **ppuVar15;
  CreateFunctionInfo *pCVar16;
  ClientContext *pCVar17;
  _Head_base<0UL,_duckdb::CreateTypeInfo_*,_false> this;
  pointer pCVar18;
  long lVar19;
  mapped_type *pmVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  undefined8 *puVar24;
  undefined8 *puVar25;
  byte bVar26;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  initializer_list<duckdb::LogicalType> __l_03;
  initializer_list<duckdb::LogicalType> __l_04;
  initializer_list<duckdb::LogicalType> __l_05;
  initializer_list<duckdb::LogicalType> __l_06;
  initializer_list<duckdb::LogicalType> __l_07;
  templated_unique_single_t alias_info;
  string alias_name;
  LogicalType minmax_type;
  LogicalType bounded_type;
  optional_ptr<duckdb::CatalogEntry,_true> sub_point_entry;
  optional_ptr<duckdb::CatalogEntry,_true> add_point_entry;
  optional_ptr<duckdb::CatalogEntry,_true> type_entry;
  LogicalType target_type;
  child_list_t<LogicalType> child_types;
  LogicalType bounded_specialized_type;
  Connection con;
  CreateScalarFunctionInfo add_point_info;
  CreateScalarFunctionInfo sub_point_info;
  ScalarFunction bounded_max;
  ScalarFunction bounded_even;
  ScalarFunction bounded_to_ascii;
  ScalarFunction bounded_add;
  ScalarFunction bounded_invert;
  CreateScalarFunctionInfo loaded_extensions_info;
  ScalarFunction loaded_extensions;
  ScalarFunction sub_point_func;
  ScalarFunction add_point_func;
  QuackFunction quack_function;
  CreateTableFunctionInfo quack_info;
  CreateScalarFunctionInfo hello_alias_info;
  undefined8 uVar27;
  undefined8 uVar28;
  LogicalType *pLVar29;
  undefined4 uVar30;
  undefined4 in_stack_ffffffffffffd70c;
  undefined4 uVar31;
  undefined4 in_stack_ffffffffffffd714;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 in_stack_ffffffffffffd720;
  undefined **ppuVar34;
  undefined8 in_stack_ffffffffffffd730;
  code *pcVar35;
  undefined8 in_stack_ffffffffffffd738;
  __uniq_ptr_impl<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>_>
  in_stack_ffffffffffffd740;
  undefined8 in_stack_ffffffffffffd748;
  undefined1 *puVar36;
  long in_stack_ffffffffffffd750;
  undefined1 in_stack_ffffffffffffd758 [16];
  undefined8 in_stack_ffffffffffffd768;
  undefined8 uVar37;
  undefined8 in_stack_ffffffffffffd770;
  undefined8 uVar38;
  undefined8 in_stack_ffffffffffffd778;
  long *plVar39;
  undefined8 uVar40;
  undefined1 in_stack_ffffffffffffd780 [48];
  undefined8 in_stack_ffffffffffffd7b0;
  undefined8 in_stack_ffffffffffffd7b8;
  undefined8 in_stack_ffffffffffffd7c0;
  CreateTypeInfo in_stack_ffffffffffffd7c8;
  CreateTypeInfo in_stack_ffffffffffffd7c9;
  undefined1 in_stack_ffffffffffffd7ca [46];
  undefined8 in_stack_ffffffffffffd7f8;
  undefined8 in_stack_ffffffffffffd800;
  undefined8 uVar41;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffd808;
  code *pcVar42;
  undefined8 in_stack_ffffffffffffd810;
  undefined8 in_stack_ffffffffffffd818;
  undefined8 in_stack_ffffffffffffd820;
  undefined8 in_stack_ffffffffffffd828;
  undefined8 in_stack_ffffffffffffd830;
  undefined8 in_stack_ffffffffffffd838;
  undefined8 in_stack_ffffffffffffd840;
  undefined8 in_stack_ffffffffffffd848;
  undefined8 in_stack_ffffffffffffd850;
  undefined8 in_stack_ffffffffffffd858;
  undefined8 in_stack_ffffffffffffd860;
  undefined8 in_stack_ffffffffffffd868;
  undefined8 in_stack_ffffffffffffd870;
  undefined8 in_stack_ffffffffffffd878;
  undefined8 in_stack_ffffffffffffd880;
  undefined8 in_stack_ffffffffffffd888;
  code *pcVar43;
  undefined8 in_stack_ffffffffffffd890;
  undefined8 in_stack_ffffffffffffd898;
  code *local_2748;
  undefined8 uStack_2740;
  code *local_2738;
  code *pcStack_2730;
  code *local_2728;
  undefined8 uStack_2720;
  code *local_2718;
  code *pcStack_2710;
  code *local_2708;
  undefined8 uStack_2700;
  code *local_26f8;
  code *pcStack_26f0;
  code *local_26e8;
  undefined8 uStack_26e0;
  code *local_26d8;
  code *pcStack_26d0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_26c8;
  _Any_data *local_26a8;
  _Any_data *local_26a0;
  _Any_data *local_2698;
  _Any_data *local_2690;
  _Any_data *local_2688;
  undefined **local_2680;
  BoundCastInfo local_2678 [16];
  long *local_2668;
  BoundCastInfo local_2660 [16];
  long *local_2650;
  BoundCastInfo local_2648 [16];
  long *local_2638;
  allocator_type local_2630 [24];
  Connection local_2618 [32];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_25f8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_25d8;
  LogicalType local_25c0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_25a8;
  LogicalType local_2590 [24];
  LogicalType local_2578 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2560;
  LogicalType local_2548 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2530;
  LogicalType local_2518 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2500;
  LogicalType local_24e8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_24d0;
  LogicalType local_24b8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_24a0;
  LogicalType local_2488 [24];
  LogicalType local_2470 [24];
  LogicalType local_2458 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2440;
  LogicalType local_2428 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2410;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_23f8;
  LogicalType local_23e0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_23c8;
  LogicalType local_23b0 [24];
  undefined1 *local_2398 [2];
  undefined1 local_2388 [16];
  undefined1 *local_2378 [2];
  undefined1 local_2368 [16];
  undefined1 *local_2358 [2];
  undefined1 local_2348 [16];
  undefined1 *local_2338 [2];
  undefined1 local_2328 [16];
  undefined1 *local_2318 [2];
  undefined1 local_2308 [16];
  undefined1 *local_22f8 [2];
  undefined1 local_22e8 [16];
  undefined1 *local_22d8 [2];
  undefined1 local_22c8 [16];
  undefined1 *local_22b8 [2];
  undefined1 local_22a8 [16];
  undefined1 *local_2298 [2];
  undefined1 local_2288 [16];
  undefined1 *local_2278 [2];
  undefined1 local_2268 [16];
  undefined1 *local_2258 [2];
  undefined1 local_2248 [16];
  undefined1 *local_2238 [2];
  undefined1 local_2228 [16];
  undefined1 *local_2218 [2];
  undefined1 local_2208 [16];
  LogicalType local_21f8 [24];
  LogicalType local_21e0 [24];
  LogicalType local_21c8 [24];
  LogicalType local_21b0 [24];
  LogicalType local_2198 [24];
  LogicalType local_2180 [24];
  LogicalType local_2168 [24];
  LogicalType local_2150 [24];
  LogicalType local_2138 [24];
  LogicalType local_2120 [24];
  undefined1 local_2108 [32];
  LogicalType local_20e8 [264];
  undefined1 *local_1fe0;
  undefined1 local_1fd0 [16];
  undefined1 *local_1fc0;
  undefined1 local_1fb0 [16];
  vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_> local_1fa0 [24];
  undefined1 *local_1f88;
  undefined1 local_1f78 [16];
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> local_1f68 [24];
  undefined1 local_1f50 [296];
  undefined1 *local_1e28;
  undefined1 local_1e18 [16];
  undefined1 *local_1e08;
  undefined1 local_1df8 [16];
  vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_> local_1de8 [24];
  undefined1 *local_1dd0;
  undefined1 local_1dc0 [16];
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> local_1db0 [24];
  undefined1 local_1d98 [16];
  element_type *local_1d88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1d80;
  LogicalType aLStack_1d08 [32];
  _Any_data _Stack_1ce8;
  _Manager_type local_1cd8;
  undefined8 auStack_1cc8 [9];
  element_type *local_1c80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c78;
  undefined1 local_1c70 [144];
  LogicalType aLStack_1be0 [32];
  _Any_data _Stack_1bc0;
  _Manager_type local_1bb0;
  undefined8 auStack_1ba0 [9];
  element_type *local_1b58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b50;
  undefined1 local_1b48 [176];
  _Any_data _Stack_1a98;
  _Manager_type local_1a88;
  undefined8 auStack_1a78 [9];
  element_type *local_1a30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a28;
  undefined1 local_1a20 [176];
  _Any_data _Stack_1970;
  _Manager_type local_1960;
  undefined8 auStack_1950 [9];
  element_type *local_1908;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1900;
  __hashtable_alloc *local_18f8 [18];
  LogicalType local_1868 [32];
  _Any_data local_1848;
  code *local_1838;
  undefined8 auStack_1828 [9];
  element_type *local_17e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_17d8;
  __hashtable_alloc *local_17d0 [18];
  LogicalType aLStack_1740 [32];
  _Any_data _Stack_1720;
  code *local_1710;
  undefined8 auStack_1700 [9];
  element_type *local_16b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_16b0;
  __hashtable_alloc *local_16a8 [18];
  LogicalType local_1618 [32];
  _Any_data local_15f8;
  code *local_15e8;
  undefined8 auStack_15d8 [9];
  element_type *local_1590;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1588;
  __hashtable_alloc *local_1580 [18];
  LogicalType local_14f0 [32];
  _Any_data local_14d0;
  code *local_14c0;
  undefined8 auStack_14b0 [9];
  element_type *local_1468;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1460;
  undefined1 local_1458 [176];
  _Any_data _Stack_13a8;
  _Manager_type local_1398;
  undefined8 auStack_1388 [9];
  element_type *local_1340;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1338;
  __hashtable_alloc *local_1330 [18];
  LogicalType local_12a0 [32];
  _Any_data local_1280;
  code *local_1270;
  undefined8 auStack_1260 [9];
  element_type *local_1218;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1210;
  __hashtable_alloc *local_1208 [18];
  LogicalType local_1178 [32];
  _Any_data local_1158;
  code *local_1148;
  undefined8 auStack_1138 [9];
  element_type *local_10f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10e8;
  __hashtable_alloc *local_10e0 [18];
  LogicalType local_1050 [32];
  _Any_data local_1030;
  code *local_1020;
  undefined8 auStack_1010 [9];
  element_type *local_fc8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_fc0;
  __hashtable_alloc *local_fb8 [18];
  LogicalType local_f28 [32];
  _Any_data local_f08;
  code *local_ef8;
  undefined8 auStack_ee8 [9];
  element_type *local_ea0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e98;
  key_type local_e90 [9];
  undefined1 *local_d68;
  undefined1 local_d58 [16];
  undefined1 *local_d48;
  undefined1 local_d38 [16];
  vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_> local_d28 [24];
  undefined1 *local_d10;
  undefined1 local_d00 [16];
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> local_cf0 [24];
  undefined **local_cd8 [18];
  undefined8 local_c48 [2];
  undefined8 local_c38;
  undefined8 local_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined1 auStack_c10 [216];
  element_type *local_b38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b30;
  TableFunctionInitialization local_b28;
  undefined1 local_b20 [176];
  _Any_data _Stack_a70;
  _Manager_type local_a60;
  undefined8 auStack_a50 [9];
  element_type *local_a08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a00;
  undefined1 local_9f8 [176];
  _Any_data _Stack_948;
  _Manager_type local_938;
  undefined8 auStack_928 [9];
  element_type *local_8e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8d8;
  undefined1 local_8d0 [176];
  _Any_data _Stack_820;
  _Manager_type local_810;
  undefined8 auStack_800 [9];
  element_type *local_7b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7b0;
  undefined1 local_7a8 [200];
  undefined1 auStack_6e0 [216];
  element_type *local_608;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_600;
  TableFunctionInitialization local_5f8;
  ScalarFunction local_5f0;
  ScalarFunction local_4c8;
  undefined **local_3a0 [37];
  undefined1 *local_278;
  undefined1 local_268 [16];
  undefined1 *local_258;
  undefined1 local_248 [16];
  vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_> local_238 [24];
  undefined1 *local_220;
  undefined1 local_210 [16];
  vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_> local_200 [24];
  undefined **local_1e8 [37];
  undefined1 *local_c0;
  undefined1 local_b0 [16];
  undefined1 *local_a0;
  undefined1 local_90 [16];
  vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_> local_80 [24];
  undefined1 *local_68;
  undefined1 local_58 [16];
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> local_48 [24];
  
  bVar26 = 0;
  local_2218[0] = local_2208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2218,"test_alias_hello","");
  local_25d8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_25d8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_25d8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duckdb::LogicalType::LogicalType(local_23b0,VARCHAR);
  uStack_26e0 = 0;
  local_26e8 = TestAliasHello;
  pcStack_26d0 = std::
                 _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                 ::_M_invoke;
  local_26d8 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
  pLVar29 = local_2120;
  duckdb::LogicalType::LogicalType(pLVar29,INVALID);
  uVar32 = 0;
  uVar31 = 0;
  uVar30 = 0;
  uVar27 = 0;
  uVar40 = 0;
  uVar38 = 0;
  duckdb::ScalarFunction::ScalarFunction(&local_4c8,local_2218,&local_25d8,local_23b0,&local_26e8,0)
  ;
  SVar4._8_8_ = uVar38;
  SVar4._0_8_ = uVar40;
  SVar4._16_8_ = uVar27;
  SVar4._24_8_ = pLVar29;
  SVar4._32_4_ = uVar30;
  SVar4._36_4_ = in_stack_ffffffffffffd70c;
  SVar4._40_4_ = uVar31;
  SVar4._44_4_ = in_stack_ffffffffffffd714;
  SVar4._48_8_ = uVar32;
  SVar4._56_8_ = in_stack_ffffffffffffd720;
  SVar4._64_8_ = db;
  SVar4._72_8_ = in_stack_ffffffffffffd730;
  SVar4._80_8_ = in_stack_ffffffffffffd738;
  SVar4._88_8_ = in_stack_ffffffffffffd740._M_t.
                 super__Tuple_impl<0UL,_duckdb::CreateTypeInfo_*,_std::default_delete<duckdb::CreateTypeInfo>_>
                 .super__Head_base<0UL,_duckdb::CreateTypeInfo_*,_false>._M_head_impl;
  SVar4._96_8_ = in_stack_ffffffffffffd748;
  SVar4._104_8_ = in_stack_ffffffffffffd750;
  SVar4._112_16_ = in_stack_ffffffffffffd758;
  SVar4._128_8_ = in_stack_ffffffffffffd768;
  SVar4._136_8_ = in_stack_ffffffffffffd770;
  SVar4._144_8_ = in_stack_ffffffffffffd778;
  SVar4._152_48_ = in_stack_ffffffffffffd780;
  SVar4.function._M_invoker = (_Invoker_type)in_stack_ffffffffffffd7b0;
  SVar4.bind = (bind_scalar_function_t)in_stack_ffffffffffffd7b8;
  SVar4.bind_extended = (bind_scalar_function_extended_t)in_stack_ffffffffffffd7c0;
  SVar4.init_local_state._0_1_ = in_stack_ffffffffffffd7c8;
  SVar4.init_local_state._1_1_ = in_stack_ffffffffffffd7c9;
  SVar4._226_46_ = in_stack_ffffffffffffd7ca;
  SVar4.deserialize = (function_deserialize_t)in_stack_ffffffffffffd7f8;
  SVar4.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_stack_ffffffffffffd800;
  SVar4.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_stack_ffffffffffffd808._M_pi;
  duckdb::CreateScalarFunctionInfo::CreateScalarFunctionInfo
            ((CreateScalarFunctionInfo *)local_1e8,SVar4);
  ppuVar34 = &PTR__ScalarFunction_00125840;
  local_4c8._0_8_ = &PTR__ScalarFunction_00125840;
  if (local_4c8.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4c8.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_4c8.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_4c8.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_4c8 + 0xb0U),(_Any_data *)((long)&local_4c8 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_4c8.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_2120);
  if (local_26d8 != (code *)0x0) {
    (*local_26d8)(&local_26e8,&local_26e8,3);
  }
  duckdb::LogicalType::~LogicalType(local_23b0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_25d8);
  if (local_2218[0] != local_2208) {
    operator_delete(local_2218[0]);
  }
  duckdb::Connection::Connection(local_2618,db);
  pCVar16 = (CreateFunctionInfo *)
            duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*
                      ((shared_ptr<duckdb::ClientContext,_true> *)local_2618);
  pCVar17 = (ClientContext *)duckdb::Catalog::GetSystemCatalog((ClientContext *)pCVar16);
  duckdb::Connection::BeginTransaction();
  pcVar1 = local_2108 + 0x10;
  local_2108._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2108,"hello","");
  duckdb::LogicalType::LogicalType((LogicalType *)local_1f50,VARCHAR);
  __l._M_len = 1;
  __l._M_array = (iterator)local_1f50;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_23c8,__l,(allocator_type *)local_e90);
  duckdb::LogicalType::LogicalType(local_23e0,INTEGER);
  duckdb::Connection::CreateScalarFunction<int,duckdb::string_t>
            (local_2618,(string *)local_2108,(vector<duckdb::LogicalType,_true> *)&local_23c8,
             local_23e0,hello_fun);
  duckdb::LogicalType::~LogicalType(local_23e0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_23c8);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_1f50);
  if ((pointer)local_2108._0_8_ != pcVar1) {
    operator_delete((void *)local_2108._0_8_);
  }
  duckdb::Catalog::CreateFunction(pCVar17,pCVar16);
  puVar36 = &stack0xffffffffffffd758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffd748,"POINT","");
  local_26c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_26c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_26c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f50._0_8_ = "x";
  local_1f50[8] = INTEGER;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_*,_duckdb::LogicalTypeId,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)local_2108,(pair<const_char_*,_duckdb::LogicalTypeId> *)local_1f50);
  std::
  vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
            ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
              *)&local_26c8,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)local_2108);
  duckdb::LogicalType::~LogicalType(local_20e8);
  if ((pointer)local_2108._0_8_ != pcVar1) {
    operator_delete((void *)local_2108._0_8_);
  }
  local_1f50._0_8_ = "y";
  local_1f50[8] = INTEGER;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_*,_duckdb::LogicalTypeId,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)local_2108,(pair<const_char_*,_duckdb::LogicalTypeId> *)local_1f50);
  std::
  vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
            ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
              *)&local_26c8,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)local_2108);
  duckdb::LogicalType::~LogicalType(local_20e8);
  if ((pointer)local_2108._0_8_ != pcVar1) {
    operator_delete((void *)local_2108._0_8_);
  }
  this._M_head_impl = (CreateTypeInfo *)operator_new(0x170);
  duckdb::CreateTypeInfo::CreateTypeInfo(this._M_head_impl);
  pCVar18 = duckdb::
            unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                        *)&stack0xffffffffffffd740);
  pCVar18[0x52] = (CreateTypeInfo)0x1;
  pCVar18 = duckdb::
            unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                        *)&stack0xffffffffffffd740);
  std::__cxx11::string::_M_assign((string *)(pCVar18 + 0x128));
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector(&local_23f8,&local_26c8);
  duckdb::LogicalType::STRUCT(&stack0xffffffffffffd7c8,&local_23f8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector(&local_23f8);
  local_2238[0] = local_2228;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2238,puVar36,puVar36 + in_stack_ffffffffffffd750);
  duckdb::LogicalType::SetAlias((pointer)&stack0xffffffffffffd7c8,local_2238);
  if (local_2238[0] != local_2228) {
    operator_delete(local_2238[0]);
  }
  pCVar18 = duckdb::
            unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>
                        *)&stack0xffffffffffffd740);
  if (pCVar18 + 0x148 != (pointer)&stack0xffffffffffffd7c8) {
    pCVar18[0x148] = in_stack_ffffffffffffd7c8;
    pCVar18[0x149] = in_stack_ffffffffffffd7c9;
    duckdb::shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pCVar18 + 0x150),
               (shared_ptr<duckdb::ExtraTypeInfo,_true> *)&stack0xffffffffffffd7d0);
  }
  duckdb::unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true>::
  operator*((unique_ptr<duckdb::CreateTypeInfo,_std::default_delete<duckdb::CreateTypeInfo>,_true> *
            )&stack0xffffffffffffd740);
  lVar19 = duckdb::Catalog::CreateType(pCVar17,(CreateTypeInfo *)pCVar16);
  duckdb::optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::CatalogEntry,_true> *)&stack0xffffffffffffd7c0);
  lVar23 = lVar19;
  local_2108._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2108,"ext:name","");
  pmVar20 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(lVar19 + 0x90),(key_type *)local_2108);
  std::__cxx11::string::_M_replace((ulong)pmVar20,0,(char *)pmVar20->_M_string_length,0x11f029);
  if ((pointer)local_2108._0_8_ != pcVar1) {
    operator_delete((void *)local_2108._0_8_);
  }
  duckdb::optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::CatalogEntry,_true> *)&stack0xffffffffffffd7c0);
  lVar19 = lVar23;
  local_2108._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2108,"ext:author","");
  pmVar20 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(lVar23 + 0x90),(key_type *)local_2108);
  std::__cxx11::string::_M_replace((ulong)pmVar20,0,(char *)pmVar20->_M_string_length,0x11f04a);
  if ((pointer)local_2108._0_8_ != pcVar1) {
    operator_delete((void *)local_2108._0_8_);
  }
  local_2258[0] = local_2248;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2258,"add_point","");
  duckdb::LogicalType::LogicalType
            ((LogicalType *)local_2108,(LogicalType *)&stack0xffffffffffffd7c8);
  duckdb::LogicalType::LogicalType
            ((LogicalType *)(local_2108 + 0x18),(LogicalType *)&stack0xffffffffffffd7c8);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_2108;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2410,__l_00,(allocator_type *)local_1f50);
  duckdb::LogicalType::LogicalType(local_2428,(LogicalType *)&stack0xffffffffffffd7c8);
  uStack_2700 = 0;
  local_2708 = AddPointFunction;
  pcStack_26f0 = std::
                 _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                 ::_M_invoke;
  local_26f8 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
  pLVar29 = local_2138;
  duckdb::LogicalType::LogicalType(pLVar29,INVALID);
  uVar32 = 0;
  uVar31 = 0;
  uVar30 = 0;
  uVar27 = 0;
  uVar40 = 0;
  uVar38 = 0;
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)local_8d0,local_2258,&local_2410,local_2428,&local_2708,0);
  duckdb::LogicalType::~LogicalType(local_2138);
  if (local_26f8 != (code *)0x0) {
    (*local_26f8)(&local_2708,&local_2708,3);
  }
  duckdb::LogicalType::~LogicalType(local_2428);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2410);
  lVar23 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType((LogicalType *)(local_2108 + lVar23));
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x18);
  if (local_2258[0] != local_2248) {
    operator_delete(local_2258[0]);
  }
  duckdb::SimpleFunction::SimpleFunction((SimpleFunction *)local_fb8,(SimpleFunction *)local_8d0);
  pcVar35 = duckdb::Catalog::CreateTableFunction;
  local_fb8[0] = (__hashtable_alloc *)duckdb::Catalog::CreateTableFunction;
  duckdb::LogicalType::LogicalType(local_f28,(LogicalType *)(local_8d0 + 0x90));
  local_f28[0x18] = (LogicalType)local_8d0[0xa8];
  local_f28[0x19] = (LogicalType)local_8d0[0xa9];
  local_f28[0x1a] = (LogicalType)local_8d0[0xaa];
  local_f28[0x1b] = (LogicalType)local_8d0[0xab];
  local_2688 = &_Stack_820;
  local_fb8[0] = (__hashtable_alloc *)ppuVar34;
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &local_f08,
             (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             local_2688);
  puVar24 = auStack_800;
  puVar25 = auStack_ee8;
  for (lVar23 = 9; lVar23 != 0; lVar23 = lVar23 + -1) {
    *puVar25 = *puVar24;
    puVar24 = puVar24 + (ulong)bVar26 * -2 + 1;
    puVar25 = puVar25 + (ulong)bVar26 * -2 + 1;
  }
  local_ea0 = local_7b8;
  local_e98 = local_7b0._M_pi;
  if (local_7b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_7b0._M_pi)->_M_use_count = (local_7b0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_7b0._M_pi)->_M_use_count = (local_7b0._M_pi)->_M_use_count + 1;
    }
  }
  SVar5._8_8_ = uVar38;
  SVar5._0_8_ = uVar40;
  SVar5._16_8_ = uVar27;
  SVar5._24_8_ = pLVar29;
  SVar5._32_4_ = uVar30;
  SVar5._36_4_ = in_stack_ffffffffffffd70c;
  SVar5._40_4_ = uVar31;
  SVar5._44_4_ = in_stack_ffffffffffffd714;
  SVar5._48_8_ = uVar32;
  SVar5._56_8_ = ppuVar34;
  SVar5._64_8_ = db;
  SVar5._72_8_ = pcVar35;
  SVar5._80_8_ = in_stack_ffffffffffffd738;
  SVar5._88_8_ = this._M_head_impl;
  SVar5._96_8_ = puVar36;
  SVar5._104_8_ = in_stack_ffffffffffffd750;
  SVar5._112_16_ = in_stack_ffffffffffffd758;
  SVar5._128_8_ = in_stack_ffffffffffffd768;
  SVar5._136_8_ = in_stack_ffffffffffffd770;
  SVar5._144_8_ = in_stack_ffffffffffffd778;
  SVar5._152_48_ = in_stack_ffffffffffffd780;
  SVar5.function._M_invoker = (_Invoker_type)in_stack_ffffffffffffd7b0;
  SVar5.bind = (bind_scalar_function_t)in_stack_ffffffffffffd7b8;
  SVar5.bind_extended = (bind_scalar_function_extended_t)lVar19;
  SVar5.init_local_state._0_1_ = in_stack_ffffffffffffd7c8;
  SVar5.init_local_state._1_1_ = in_stack_ffffffffffffd7c9;
  SVar5._226_46_ = in_stack_ffffffffffffd7ca;
  SVar5.deserialize = (function_deserialize_t)in_stack_ffffffffffffd7f8;
  SVar5.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_stack_ffffffffffffd800;
  SVar5.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_stack_ffffffffffffd808._M_pi;
  duckdb::CreateScalarFunctionInfo::CreateScalarFunctionInfo
            ((CreateScalarFunctionInfo *)local_2108,SVar5);
  local_fb8[0] = (__hashtable_alloc *)ppuVar34;
  if (local_e98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e98);
  }
  if (local_ef8 != (code *)0x0) {
    (*local_ef8)(&local_f08,&local_f08,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_fb8);
  lVar21 = duckdb::Catalog::CreateFunction(pCVar17,pCVar16);
  duckdb::optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::CatalogEntry,_true> *)&stack0xffffffffffffd7b8);
  pcVar2 = local_1f50 + 0x10;
  lVar23 = lVar21;
  local_1f50._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f50,"ext:name","");
  pmVar20 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(lVar21 + 0x90),(key_type *)local_1f50);
  std::__cxx11::string::_M_replace((ulong)pmVar20,0,(char *)pmVar20->_M_string_length,0x11f029);
  if ((char *)local_1f50._0_8_ != pcVar2) {
    operator_delete((void *)local_1f50._0_8_);
  }
  duckdb::optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::CatalogEntry,_true> *)&stack0xffffffffffffd7b8);
  lVar21 = lVar23;
  local_1f50._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f50,"ext:author","");
  pmVar20 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(lVar23 + 0x90),(key_type *)local_1f50);
  std::__cxx11::string::_M_replace((ulong)pmVar20,0,(char *)pmVar20->_M_string_length,0x11f04a);
  if ((char *)local_1f50._0_8_ != pcVar2) {
    operator_delete((void *)local_1f50._0_8_);
  }
  local_2278[0] = local_2268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2278,"sub_point","");
  duckdb::LogicalType::LogicalType
            ((LogicalType *)local_1f50,(LogicalType *)&stack0xffffffffffffd7c8);
  duckdb::LogicalType::LogicalType
            ((LogicalType *)(local_1f50 + 0x18),(LogicalType *)&stack0xffffffffffffd7c8);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_1f50;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2440,__l_01,(allocator_type *)local_e90);
  duckdb::LogicalType::LogicalType(local_2458,(LogicalType *)&stack0xffffffffffffd7c8);
  uStack_2720 = 0;
  local_2728 = SubPointFunction;
  pcStack_2710 = std::
                 _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                 ::_M_invoke;
  local_2718 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
  pLVar29 = local_2150;
  duckdb::LogicalType::LogicalType(pLVar29,INVALID);
  uVar32 = 0;
  uVar31 = 0;
  uVar30 = 0;
  uVar27 = 0;
  uVar40 = 0;
  uVar38 = 0;
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)local_9f8,local_2278,&local_2440,local_2458,&local_2728,0);
  duckdb::LogicalType::~LogicalType(local_2150);
  if (local_2718 != (code *)0x0) {
    (*local_2718)(&local_2728,&local_2728,3);
  }
  duckdb::LogicalType::~LogicalType(local_2458);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2440);
  lVar23 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType((LogicalType *)(local_1f50 + lVar23));
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x18);
  if (local_2278[0] != local_2268) {
    operator_delete(local_2278[0]);
  }
  duckdb::SimpleFunction::SimpleFunction((SimpleFunction *)local_10e0,(SimpleFunction *)local_9f8);
  local_10e0[0] = (__hashtable_alloc *)pcVar35;
  duckdb::LogicalType::LogicalType(local_1050,(LogicalType *)(local_9f8 + 0x90));
  local_1050[0x18] = (LogicalType)local_9f8[0xa8];
  local_1050[0x19] = (LogicalType)local_9f8[0xa9];
  local_1050[0x1a] = (LogicalType)local_9f8[0xaa];
  local_1050[0x1b] = (LogicalType)local_9f8[0xab];
  local_2690 = &_Stack_948;
  local_10e0[0] = (__hashtable_alloc *)ppuVar34;
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &local_1030,
             (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             local_2690);
  puVar24 = auStack_928;
  puVar25 = auStack_1010;
  for (lVar23 = 9; lVar23 != 0; lVar23 = lVar23 + -1) {
    *puVar25 = *puVar24;
    puVar24 = puVar24 + (ulong)bVar26 * -2 + 1;
    puVar25 = puVar25 + (ulong)bVar26 * -2 + 1;
  }
  local_fc8 = local_8e0;
  local_fc0 = local_8d8._M_pi;
  if (local_8d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_8d8._M_pi)->_M_use_count = (local_8d8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_8d8._M_pi)->_M_use_count = (local_8d8._M_pi)->_M_use_count + 1;
    }
  }
  SVar6._8_8_ = uVar38;
  SVar6._0_8_ = uVar40;
  SVar6._16_8_ = uVar27;
  SVar6._24_8_ = pLVar29;
  SVar6._32_4_ = uVar30;
  SVar6._36_4_ = in_stack_ffffffffffffd70c;
  SVar6._40_4_ = uVar31;
  SVar6._44_4_ = in_stack_ffffffffffffd714;
  SVar6._48_8_ = uVar32;
  SVar6._56_8_ = ppuVar34;
  SVar6._64_8_ = db;
  SVar6._72_8_ = pcVar35;
  SVar6._80_8_ = in_stack_ffffffffffffd738;
  SVar6._88_8_ = this._M_head_impl;
  SVar6._96_8_ = puVar36;
  SVar6._104_8_ = in_stack_ffffffffffffd750;
  SVar6._112_16_ = in_stack_ffffffffffffd758;
  SVar6._128_8_ = in_stack_ffffffffffffd768;
  SVar6._136_8_ = in_stack_ffffffffffffd770;
  SVar6._144_8_ = in_stack_ffffffffffffd778;
  SVar6._152_48_ = in_stack_ffffffffffffd780;
  SVar6.function._M_invoker = (_Invoker_type)in_stack_ffffffffffffd7b0;
  SVar6.bind = (bind_scalar_function_t)lVar21;
  SVar6.bind_extended = (bind_scalar_function_extended_t)lVar19;
  SVar6.init_local_state._0_1_ = in_stack_ffffffffffffd7c8;
  SVar6.init_local_state._1_1_ = in_stack_ffffffffffffd7c9;
  SVar6._226_46_ = in_stack_ffffffffffffd7ca;
  SVar6.deserialize = (function_deserialize_t)in_stack_ffffffffffffd7f8;
  SVar6.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_stack_ffffffffffffd800;
  SVar6.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_stack_ffffffffffffd808._M_pi;
  duckdb::CreateScalarFunctionInfo::CreateScalarFunctionInfo
            ((CreateScalarFunctionInfo *)local_1f50,SVar6);
  local_10e0[0] = (__hashtable_alloc *)ppuVar34;
  if (local_fc0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_fc0);
  }
  if (local_1020 != (code *)0x0) {
    (*local_1020)(&local_1030,&local_1030,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_10e0);
  lVar22 = duckdb::Catalog::CreateFunction(pCVar17,pCVar16);
  duckdb::optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::CatalogEntry,_true> *)&stack0xffffffffffffd7b0);
  paVar3 = &local_e90[0].field_2;
  lVar23 = lVar22;
  local_e90[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e90,"ext:name","");
  pmVar20 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(lVar22 + 0x90),local_e90);
  std::__cxx11::string::_M_replace((ulong)pmVar20,0,(char *)pmVar20->_M_string_length,0x11f029);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e90[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_e90[0]._M_dataplus._M_p);
  }
  duckdb::optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::CatalogEntry,_true> *)&stack0xffffffffffffd7b0);
  lVar22 = lVar23;
  local_e90[0]._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e90,"ext:author","");
  pmVar20 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)(lVar23 + 0x90),local_e90);
  std::__cxx11::string::_M_replace((ulong)pmVar20,0,(char *)pmVar20->_M_string_length,0x11f04a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e90[0]._M_dataplus._M_p != paVar3) {
    operator_delete(local_e90[0]._M_dataplus._M_p);
  }
  local_2298[0] = local_2288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2298,"loaded_extensions","");
  local_25f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_25f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_25f8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duckdb::LogicalType::LogicalType(local_2470,VARCHAR);
  uStack_2740 = 0;
  local_2748 = LoadedExtensionsFunction;
  pcStack_2730 = std::
                 _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                 ::_M_invoke;
  local_2738 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_manager;
  pLVar29 = local_2168;
  duckdb::LogicalType::LogicalType(pLVar29,INVALID);
  uVar32 = 0;
  uVar31 = 0;
  uVar30 = 0;
  uVar27 = 0;
  uVar40 = 0;
  uVar38 = 0;
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)local_b20,local_2298,&local_25f8,local_2470,&local_2748,0);
  duckdb::LogicalType::~LogicalType(local_2168);
  if (local_2738 != (code *)0x0) {
    (*local_2738)(&local_2748,&local_2748,3);
  }
  duckdb::LogicalType::~LogicalType(local_2470);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_25f8);
  if (local_2298[0] != local_2288) {
    operator_delete(local_2298[0]);
  }
  duckdb::SimpleFunction::SimpleFunction((SimpleFunction *)local_1208,(SimpleFunction *)local_b20);
  local_1208[0] = (__hashtable_alloc *)pcVar35;
  duckdb::LogicalType::LogicalType(local_1178,(LogicalType *)(local_b20 + 0x90));
  local_1178[0x18] = (LogicalType)local_b20[0xa8];
  local_1178[0x19] = (LogicalType)local_b20[0xa9];
  local_1178[0x1a] = (LogicalType)local_b20[0xaa];
  local_1178[0x1b] = (LogicalType)local_b20[0xab];
  local_2698 = &_Stack_a70;
  local_1208[0] = (__hashtable_alloc *)ppuVar34;
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &local_1158,
             (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             local_2698);
  puVar24 = auStack_a50;
  puVar25 = auStack_1138;
  for (lVar23 = 9; lVar23 != 0; lVar23 = lVar23 + -1) {
    *puVar25 = *puVar24;
    puVar24 = puVar24 + (ulong)bVar26 * -2 + 1;
    puVar25 = puVar25 + (ulong)bVar26 * -2 + 1;
  }
  local_10f0 = local_a08;
  local_10e8 = local_a00._M_pi;
  if (local_a00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a00._M_pi)->_M_use_count = (local_a00._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a00._M_pi)->_M_use_count = (local_a00._M_pi)->_M_use_count + 1;
    }
  }
  SVar7._8_8_ = uVar38;
  SVar7._0_8_ = uVar40;
  SVar7._16_8_ = uVar27;
  SVar7._24_8_ = pLVar29;
  SVar7._32_4_ = uVar30;
  SVar7._36_4_ = in_stack_ffffffffffffd70c;
  SVar7._40_4_ = uVar31;
  SVar7._44_4_ = in_stack_ffffffffffffd714;
  SVar7._48_8_ = uVar32;
  SVar7._56_8_ = ppuVar34;
  SVar7._64_8_ = db;
  SVar7._72_8_ = pcVar35;
  SVar7._80_8_ = in_stack_ffffffffffffd738;
  SVar7._88_8_ = this._M_head_impl;
  SVar7._96_8_ = puVar36;
  SVar7._104_8_ = in_stack_ffffffffffffd750;
  SVar7._112_16_ = in_stack_ffffffffffffd758;
  SVar7._128_8_ = in_stack_ffffffffffffd768;
  SVar7._136_8_ = in_stack_ffffffffffffd770;
  SVar7._144_8_ = in_stack_ffffffffffffd778;
  SVar7._152_48_ = in_stack_ffffffffffffd780;
  SVar7.function._M_invoker = (_Invoker_type)lVar22;
  SVar7.bind = (bind_scalar_function_t)lVar21;
  SVar7.bind_extended = (bind_scalar_function_extended_t)lVar19;
  SVar7.init_local_state._0_1_ = in_stack_ffffffffffffd7c8;
  SVar7.init_local_state._1_1_ = in_stack_ffffffffffffd7c9;
  SVar7._226_46_ = in_stack_ffffffffffffd7ca;
  SVar7.deserialize = (function_deserialize_t)in_stack_ffffffffffffd7f8;
  SVar7.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_stack_ffffffffffffd800;
  SVar7.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_stack_ffffffffffffd808._M_pi;
  duckdb::CreateScalarFunctionInfo::CreateScalarFunctionInfo
            ((CreateScalarFunctionInfo *)local_e90,SVar7);
  local_1208[0] = (__hashtable_alloc *)ppuVar34;
  if (local_10e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10e8);
  }
  if (local_1148 != (code *)0x0) {
    (*local_1148)(&local_1158,&local_1158,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_1208);
  duckdb::Catalog::CreateFunction(pCVar17,pCVar16);
  QuackFunction::QuackFunction((QuackFunction *)local_7a8);
  duckdb::SimpleFunction::SimpleFunction((SimpleFunction *)local_cd8,(SimpleFunction *)local_7a8);
  local_cd8[0] = (undefined **)&__cxxabiv1::__si_class_type_info::vtable;
  local_1d98._0_8_ = local_c48;
  local_c48[0] = 0;
  local_c48[1] = local_7a8._152_8_;
  local_c38 = 0;
  local_c30 = local_7a8._168_8_;
  local_c28 = local_7a8._176_8_;
  uStack_c20 = local_7a8._184_8_;
  local_c18 = 0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_1d98._0_8_,
             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)(local_7a8 + 0x90),
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
              *)local_1d98);
  local_cd8[0] = &PTR__TableFunction_00125990;
  memcpy(auStack_c10,auStack_6e0,0xd6);
  local_b38 = local_608;
  local_b30 = local_600._M_pi;
  if (local_600._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_600._M_pi)->_M_use_count = (local_600._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_600._M_pi)->_M_use_count = (local_600._M_pi)->_M_use_count + 1;
    }
  }
  local_b28 = local_5f8;
  TVar14._8_8_ = uVar38;
  TVar14._0_8_ = uVar40;
  TVar14._16_8_ = uVar27;
  TVar14._24_8_ = pLVar29;
  TVar14._32_4_ = uVar30;
  TVar14._36_4_ = in_stack_ffffffffffffd70c;
  TVar14._40_4_ = uVar31;
  TVar14._44_4_ = in_stack_ffffffffffffd714;
  TVar14._48_8_ = uVar32;
  TVar14._56_8_ = ppuVar34;
  TVar14._64_8_ = db;
  TVar14._72_8_ = pcVar35;
  TVar14._80_8_ = in_stack_ffffffffffffd738;
  TVar14._88_8_ = this._M_head_impl;
  TVar14._96_8_ = puVar36;
  TVar14._104_8_ = in_stack_ffffffffffffd750;
  TVar14._112_16_ = in_stack_ffffffffffffd758;
  TVar14._128_8_ = in_stack_ffffffffffffd768;
  TVar14._136_8_ = in_stack_ffffffffffffd770;
  TVar14._144_8_ = in_stack_ffffffffffffd778;
  TVar14._152_48_ = in_stack_ffffffffffffd780;
  TVar14.bind = (table_function_bind_t)lVar22;
  TVar14.bind_replace = (table_function_bind_replace_t)lVar21;
  TVar14.bind_operator = (table_function_bind_operator_t)lVar19;
  TVar14.init_global._0_1_ = in_stack_ffffffffffffd7c8;
  TVar14.init_global._1_1_ = in_stack_ffffffffffffd7c9;
  TVar14._226_46_ = in_stack_ffffffffffffd7ca;
  TVar14.dependency = (table_function_dependency_t)in_stack_ffffffffffffd7f8;
  TVar14.cardinality = (table_function_cardinality_t)in_stack_ffffffffffffd800;
  TVar14.pushdown_complex_filter =
       (table_function_pushdown_complex_filter_t)in_stack_ffffffffffffd808._M_pi;
  TVar14.pushdown_expression = (table_function_pushdown_expression_t)in_stack_ffffffffffffd810;
  TVar14.to_string = (table_function_to_string_t)in_stack_ffffffffffffd818;
  TVar14.dynamic_to_string = (table_function_dynamic_to_string_t)in_stack_ffffffffffffd820;
  TVar14.table_scan_progress = (table_function_progress_t)in_stack_ffffffffffffd828;
  TVar14.get_partition_data = (table_function_get_partition_data_t)in_stack_ffffffffffffd830;
  TVar14.get_bind_info = (table_function_get_bind_info_t)in_stack_ffffffffffffd838;
  TVar14.type_pushdown = (table_function_type_pushdown_t)in_stack_ffffffffffffd840;
  TVar14.get_multi_file_reader = (table_function_get_multi_file_reader_t)in_stack_ffffffffffffd848;
  TVar14.supports_pushdown_type = (table_function_supports_pushdown_type_t)in_stack_ffffffffffffd850
  ;
  TVar14.get_partition_info = (table_function_get_partition_info_t)in_stack_ffffffffffffd858;
  TVar14.get_partition_stats = (table_function_get_partition_stats_t)in_stack_ffffffffffffd860;
  TVar14.get_virtual_columns = (table_function_get_virtual_columns_t)in_stack_ffffffffffffd868;
  TVar14.serialize = (table_function_serialize_t)in_stack_ffffffffffffd870;
  TVar14.deserialize = (table_function_deserialize_t)in_stack_ffffffffffffd878;
  TVar14.verify_serialization = (bool)(char)in_stack_ffffffffffffd880;
  TVar14.projection_pushdown = (bool)(char)((ulong)in_stack_ffffffffffffd880 >> 8);
  TVar14.filter_pushdown = (bool)(char)((ulong)in_stack_ffffffffffffd880 >> 0x10);
  TVar14.filter_prune = (bool)(char)((ulong)in_stack_ffffffffffffd880 >> 0x18);
  TVar14.sampling_pushdown = (bool)(char)((ulong)in_stack_ffffffffffffd880 >> 0x20);
  TVar14.late_materialization = (bool)(char)((ulong)in_stack_ffffffffffffd880 >> 0x28);
  TVar14._414_2_ = (short)((ulong)in_stack_ffffffffffffd880 >> 0x30);
  TVar14.function_info.internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_stack_ffffffffffffd888;
  TVar14.function_info.internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_stack_ffffffffffffd890;
  TVar14._432_8_ = in_stack_ffffffffffffd898;
  duckdb::CreateTableFunctionInfo::CreateTableFunctionInfo
            ((CreateTableFunctionInfo *)local_3a0,TVar14);
  local_cd8[0] = &PTR__TableFunction_00125990;
  if (local_b30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b30);
  }
  duckdb::SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_cd8);
  duckdb::Catalog::CreateTableFunction(pCVar17,(CreateTableFunctionInfo *)pCVar16);
  duckdb::Connection::Commit();
  lVar23 = duckdb::DBConfig::GetConfig(db);
  local_1d88 = (element_type *)0x0;
  _Stack_1d80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1d98._0_8_ = QuackExtension::QuackParseFunction;
  local_1d98._8_8_ = QuackExtension::QuackPlanFunction;
  std::vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_>::
  emplace_back<duckdb::ParserExtension>
            ((vector<duckdb::ParserExtension,_std::allocator<duckdb::ParserExtension>_> *)
             (lVar23 + 0x578),(ParserExtension *)local_1d98);
  if (_Stack_1d80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1d80._M_pi);
  }
  local_1d98._0_8_ = operator_new(8);
  *(undefined ***)local_1d98._0_8_ = &PTR__ExtensionCallback_00125c00;
  std::
  vector<duckdb::unique_ptr<duckdb::ExtensionCallback,std::default_delete<duckdb::ExtensionCallback>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,std::default_delete<duckdb::ExtensionCallback>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExtensionCallback,std::default_delete<duckdb::ExtensionCallback>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExtensionCallback,std::default_delete<duckdb::ExtensionCallback>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExtensionCallback,std::default_delete<duckdb::ExtensionCallback>,true>>>
              *)(lVar23 + 0x630),
             (unique_ptr<duckdb::ExtensionCallback,_std::default_delete<duckdb::ExtensionCallback>,_true>
              *)local_1d98);
  if ((__hashtable_alloc *)local_1d98._0_8_ != (__hashtable_alloc *)0x0) {
    (**(code **)(*(long *)local_1d98._0_8_ + 8))();
  }
  BoundedType::GetDefault();
  local_22b8[0] = local_22a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_22b8,"BOUNDED","");
  duckdb::LogicalType::LogicalType(local_2488,(LogicalType *)&stack0xffffffffffffd798);
  duckdb::ExtensionUtil::RegisterType(db,local_22b8,local_2488,BoundedType::Bind);
  duckdb::LogicalType::~LogicalType(local_2488);
  if (local_22b8[0] != local_22a8) {
    operator_delete(local_22b8[0]);
  }
  local_22d8[0] = local_22c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_22d8,"bounded_max","");
  duckdb::LogicalType::LogicalType
            ((LogicalType *)local_1458,(LogicalType *)&stack0xffffffffffffd798);
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)local_1458;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_24a0,__l_02,(allocator_type *)local_1a20);
  local_2680 = &PTR__TableFunction_00125990;
  duckdb::LogicalType::LogicalType(local_24b8,INTEGER);
  pLVar29 = local_2180;
  duckdb::LogicalType::LogicalType(pLVar29,INVALID);
  uVar32 = 0;
  uVar31 = 0;
  uVar30 = 0;
  uVar27 = 0;
  uVar40 = 0;
  uVar38 = 0;
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)local_1d98,local_22d8,&local_24a0,local_24b8,&stack0xffffffffffffd898
             ,BoundedMaxBind);
  duckdb::LogicalType::~LogicalType(local_2180);
  std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xffffffffffffd898,(_Any_data *)&stack0xffffffffffffd898,
               __destroy_functor);
  duckdb::LogicalType::~LogicalType(local_24b8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_24a0);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_1458);
  if (local_22d8[0] != local_22c8) {
    operator_delete(local_22d8[0]);
  }
  duckdb::SimpleFunction::SimpleFunction((SimpleFunction *)local_1330,(SimpleFunction *)local_1d98);
  local_1330[0] = (__hashtable_alloc *)pcVar35;
  duckdb::LogicalType::LogicalType(local_12a0,aLStack_1d08);
  local_12a0[0x18] = aLStack_1d08[0x18];
  local_12a0[0x19] = aLStack_1d08[0x19];
  local_12a0[0x1a] = aLStack_1d08[0x1a];
  local_12a0[0x1b] = aLStack_1d08[0x1b];
  local_26a0 = &_Stack_1ce8;
  local_1330[0] = (__hashtable_alloc *)ppuVar34;
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &local_1280,
             (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             local_26a0);
  puVar24 = auStack_1cc8;
  puVar25 = auStack_1260;
  for (lVar23 = 9; lVar23 != 0; lVar23 = lVar23 + -1) {
    *puVar25 = *puVar24;
    puVar24 = puVar24 + (ulong)bVar26 * -2 + 1;
    puVar25 = puVar25 + (ulong)bVar26 * -2 + 1;
  }
  local_1218 = local_1c80;
  local_1210 = local_1c78._M_pi;
  if (local_1c78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1c78._M_pi)->_M_use_count = (local_1c78._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1c78._M_pi)->_M_use_count = (local_1c78._M_pi)->_M_use_count + 1;
    }
  }
  SVar8._8_8_ = uVar38;
  SVar8._0_8_ = uVar40;
  SVar8._16_8_ = uVar27;
  SVar8._24_8_ = pLVar29;
  SVar8._32_4_ = uVar30;
  SVar8._36_4_ = in_stack_ffffffffffffd70c;
  SVar8._40_4_ = uVar31;
  SVar8._44_4_ = in_stack_ffffffffffffd714;
  SVar8._48_8_ = uVar32;
  SVar8._56_8_ = ppuVar34;
  SVar8._64_8_ = db;
  SVar8._72_8_ = pcVar35;
  SVar8._80_8_ = in_stack_ffffffffffffd738;
  SVar8._88_8_ = this._M_head_impl;
  SVar8._96_8_ = puVar36;
  SVar8._104_8_ = in_stack_ffffffffffffd750;
  SVar8._112_16_ = in_stack_ffffffffffffd758;
  SVar8._128_8_ = in_stack_ffffffffffffd768;
  SVar8._136_8_ = in_stack_ffffffffffffd770;
  SVar8._144_8_ = in_stack_ffffffffffffd778;
  SVar8._152_48_ = in_stack_ffffffffffffd780;
  SVar8.function._M_invoker = (_Invoker_type)lVar22;
  SVar8.bind = (bind_scalar_function_t)lVar21;
  SVar8.bind_extended = (bind_scalar_function_extended_t)lVar19;
  SVar8.init_local_state._0_1_ = in_stack_ffffffffffffd7c8;
  SVar8.init_local_state._1_1_ = in_stack_ffffffffffffd7c9;
  SVar8._226_46_ = in_stack_ffffffffffffd7ca;
  SVar8.deserialize = (function_deserialize_t)in_stack_ffffffffffffd7f8;
  SVar8.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_stack_ffffffffffffd800;
  SVar8.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_stack_ffffffffffffd808._M_pi;
  duckdb::ExtensionUtil::RegisterFunction(db,SVar8);
  local_1330[0] = (__hashtable_alloc *)ppuVar34;
  if (local_1210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1210);
  }
  if (local_1270 != (code *)0x0) {
    (*local_1270)(&local_1280,&local_1280,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_1330);
  local_22f8[0] = local_22e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_22f8,"bounded_invert","");
  duckdb::LogicalType::LogicalType
            ((LogicalType *)local_1a20,(LogicalType *)&stack0xffffffffffffd798);
  __l_03._M_len = 1;
  __l_03._M_array = (iterator)local_1a20;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_24d0,__l_03,(allocator_type *)local_1c70);
  duckdb::LogicalType::LogicalType(local_24e8,(LogicalType *)&stack0xffffffffffffd798);
  pcVar43 = std::
            _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
            ::_M_manager;
  pLVar29 = local_2198;
  duckdb::LogicalType::LogicalType(pLVar29,INVALID);
  uVar32 = 0;
  uVar31 = 0;
  uVar30 = 0;
  uVar27 = 0;
  uVar40 = 0;
  uVar38 = 0;
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)local_1458,local_22f8,&local_24d0,local_24e8,&stack0xffffffffffffd878
             ,BoundedInvertBind);
  duckdb::LogicalType::~LogicalType(local_2198);
  if (pcVar43 != (code *)0x0) {
    (*pcVar43)(&stack0xffffffffffffd878,&stack0xffffffffffffd878,3);
  }
  duckdb::LogicalType::~LogicalType(local_24e8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_24d0);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_1a20);
  if (local_22f8[0] != local_22e8) {
    operator_delete(local_22f8[0]);
  }
  duckdb::SimpleFunction::SimpleFunction((SimpleFunction *)local_1580,(SimpleFunction *)local_1458);
  local_1580[0] = (__hashtable_alloc *)pcVar35;
  duckdb::LogicalType::LogicalType(local_14f0,(LogicalType *)(local_1458 + 0x90));
  local_14f0[0x18] = (LogicalType)local_1458[0xa8];
  local_14f0[0x19] = (LogicalType)local_1458[0xa9];
  local_14f0[0x1a] = (LogicalType)local_1458[0xaa];
  local_14f0[0x1b] = (LogicalType)local_1458[0xab];
  local_26a8 = &_Stack_13a8;
  local_1580[0] = (__hashtable_alloc *)ppuVar34;
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &local_14d0,
             (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             local_26a8);
  puVar24 = auStack_1388;
  puVar25 = auStack_14b0;
  for (lVar23 = 9; lVar23 != 0; lVar23 = lVar23 + -1) {
    *puVar25 = *puVar24;
    puVar24 = puVar24 + (ulong)bVar26 * -2 + 1;
    puVar25 = puVar25 + (ulong)bVar26 * -2 + 1;
  }
  local_1468 = local_1340;
  local_1460 = local_1338._M_pi;
  if (local_1338._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1338._M_pi)->_M_use_count = (local_1338._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1338._M_pi)->_M_use_count = (local_1338._M_pi)->_M_use_count + 1;
    }
  }
  SVar9._8_8_ = uVar38;
  SVar9._0_8_ = uVar40;
  SVar9._16_8_ = uVar27;
  SVar9._24_8_ = pLVar29;
  SVar9._32_4_ = uVar30;
  SVar9._36_4_ = in_stack_ffffffffffffd70c;
  SVar9._40_4_ = uVar31;
  SVar9._44_4_ = in_stack_ffffffffffffd714;
  SVar9._48_8_ = uVar32;
  SVar9._56_8_ = ppuVar34;
  SVar9._64_8_ = db;
  SVar9._72_8_ = pcVar35;
  SVar9._80_8_ = in_stack_ffffffffffffd738;
  SVar9._88_8_ = this._M_head_impl;
  SVar9._96_8_ = puVar36;
  SVar9._104_8_ = in_stack_ffffffffffffd750;
  SVar9._112_16_ = in_stack_ffffffffffffd758;
  SVar9._128_8_ = in_stack_ffffffffffffd768;
  SVar9._136_8_ = in_stack_ffffffffffffd770;
  SVar9._144_8_ = in_stack_ffffffffffffd778;
  SVar9._152_48_ = in_stack_ffffffffffffd780;
  SVar9.function._M_invoker = (_Invoker_type)lVar22;
  SVar9.bind = (bind_scalar_function_t)lVar21;
  SVar9.bind_extended = (bind_scalar_function_extended_t)lVar19;
  SVar9.init_local_state._0_1_ = in_stack_ffffffffffffd7c8;
  SVar9.init_local_state._1_1_ = in_stack_ffffffffffffd7c9;
  SVar9._226_46_ = in_stack_ffffffffffffd7ca;
  SVar9.deserialize = (function_deserialize_t)in_stack_ffffffffffffd7f8;
  SVar9.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_stack_ffffffffffffd800;
  SVar9.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_stack_ffffffffffffd808._M_pi;
  duckdb::ExtensionUtil::RegisterFunction(db,SVar9);
  local_1580[0] = (__hashtable_alloc *)ppuVar34;
  if (local_1460 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1460);
  }
  if (local_14c0 != (code *)0x0) {
    (*local_14c0)(&local_14d0,&local_14d0,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_1580);
  local_2318[0] = local_2308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2318,"bounded_add","");
  duckdb::LogicalType::LogicalType
            ((LogicalType *)local_1c70,(LogicalType *)&stack0xffffffffffffd798);
  duckdb::LogicalType::LogicalType
            ((LogicalType *)(local_1c70 + 0x18),(LogicalType *)&stack0xffffffffffffd798);
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)local_1c70;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2500,__l_04,(allocator_type *)local_1b48);
  duckdb::LogicalType::LogicalType(local_2518,(LogicalType *)&stack0xffffffffffffd798);
  pcVar43 = std::
            _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
            ::_M_manager;
  pLVar29 = local_21b0;
  duckdb::LogicalType::LogicalType(pLVar29,INVALID);
  uVar32 = 0;
  uVar31 = 0;
  uVar30 = 0;
  uVar27 = 0;
  uVar40 = 0;
  uVar38 = 0;
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)local_1a20,local_2318,&local_2500,local_2518,&stack0xffffffffffffd858
             ,BoundedAddBind);
  duckdb::LogicalType::~LogicalType(local_21b0);
  if (pcVar43 != (code *)0x0) {
    (*pcVar43)(&stack0xffffffffffffd858,&stack0xffffffffffffd858,3);
  }
  duckdb::LogicalType::~LogicalType(local_2518);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2500);
  lVar23 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType((LogicalType *)(local_1c70 + lVar23));
    lVar23 = lVar23 + -0x18;
  } while (lVar23 != -0x18);
  if (local_2318[0] != local_2308) {
    operator_delete(local_2318[0]);
  }
  duckdb::SimpleFunction::SimpleFunction((SimpleFunction *)local_16a8,(SimpleFunction *)local_1a20);
  local_16a8[0] = (__hashtable_alloc *)pcVar35;
  duckdb::LogicalType::LogicalType(local_1618,(LogicalType *)(local_1a20 + 0x90));
  local_1618[0x18] = (LogicalType)local_1a20[0xa8];
  local_1618[0x19] = (LogicalType)local_1a20[0xa9];
  local_1618[0x1a] = (LogicalType)local_1a20[0xaa];
  local_1618[0x1b] = (LogicalType)local_1a20[0xab];
  local_16a8[0] = (__hashtable_alloc *)ppuVar34;
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &local_15f8,
             (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &_Stack_1970);
  puVar24 = auStack_1950;
  puVar25 = auStack_15d8;
  for (lVar23 = 9; lVar23 != 0; lVar23 = lVar23 + -1) {
    *puVar25 = *puVar24;
    puVar24 = puVar24 + (ulong)bVar26 * -2 + 1;
    puVar25 = puVar25 + (ulong)bVar26 * -2 + 1;
  }
  local_1590 = local_1908;
  local_1588 = local_1900._M_pi;
  if (local_1900._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1900._M_pi)->_M_use_count = (local_1900._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1900._M_pi)->_M_use_count = (local_1900._M_pi)->_M_use_count + 1;
    }
  }
  SVar10._8_8_ = uVar38;
  SVar10._0_8_ = uVar40;
  SVar10._16_8_ = uVar27;
  SVar10._24_8_ = pLVar29;
  SVar10._32_4_ = uVar30;
  SVar10._36_4_ = in_stack_ffffffffffffd70c;
  SVar10._40_4_ = uVar31;
  SVar10._44_4_ = in_stack_ffffffffffffd714;
  SVar10._48_8_ = uVar32;
  SVar10._56_8_ = ppuVar34;
  SVar10._64_8_ = db;
  SVar10._72_8_ = pcVar35;
  SVar10._80_8_ = in_stack_ffffffffffffd738;
  SVar10._88_8_ = this._M_head_impl;
  SVar10._96_8_ = puVar36;
  SVar10._104_8_ = in_stack_ffffffffffffd750;
  SVar10._112_16_ = in_stack_ffffffffffffd758;
  SVar10._128_8_ = in_stack_ffffffffffffd768;
  SVar10._136_8_ = in_stack_ffffffffffffd770;
  SVar10._144_8_ = in_stack_ffffffffffffd778;
  SVar10._152_48_ = in_stack_ffffffffffffd780;
  SVar10.function._M_invoker = (_Invoker_type)lVar22;
  SVar10.bind = (bind_scalar_function_t)lVar21;
  SVar10.bind_extended = (bind_scalar_function_extended_t)lVar19;
  SVar10.init_local_state._0_1_ = in_stack_ffffffffffffd7c8;
  SVar10.init_local_state._1_1_ = in_stack_ffffffffffffd7c9;
  SVar10._226_46_ = in_stack_ffffffffffffd7ca;
  SVar10.deserialize = (function_deserialize_t)in_stack_ffffffffffffd7f8;
  SVar10.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_stack_ffffffffffffd800;
  SVar10.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_stack_ffffffffffffd808._M_pi;
  duckdb::ExtensionUtil::RegisterFunction(db,SVar10);
  local_16a8[0] = (__hashtable_alloc *)ppuVar34;
  if (local_1588 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1588);
  }
  if (local_15e8 != (code *)0x0) {
    (*local_15e8)(&local_15f8,&local_15f8,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_16a8);
  local_2338[0] = local_2328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2338,"bounded_even","");
  duckdb::LogicalType::LogicalType
            ((LogicalType *)local_1b48,(LogicalType *)&stack0xffffffffffffd798);
  __l_05._M_len = 1;
  __l_05._M_array = (iterator)local_1b48;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2530,__l_05,local_2630);
  duckdb::LogicalType::LogicalType(local_2548,BOOLEAN);
  pcVar43 = std::
            _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
            ::_M_manager;
  pLVar29 = local_21c8;
  duckdb::LogicalType::LogicalType(pLVar29,INVALID);
  uVar32 = 0;
  uVar31 = 0;
  uVar30 = 0;
  uVar27 = 0;
  uVar40 = 0;
  uVar38 = 0;
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)local_1c70,local_2338,&local_2530,local_2548,&stack0xffffffffffffd838
             ,0);
  duckdb::LogicalType::~LogicalType(local_21c8);
  if (pcVar43 != (code *)0x0) {
    (*pcVar43)(&stack0xffffffffffffd838,&stack0xffffffffffffd838,3);
  }
  duckdb::LogicalType::~LogicalType(local_2548);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2530);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_1b48);
  if (local_2338[0] != local_2328) {
    operator_delete(local_2338[0]);
  }
  duckdb::SimpleFunction::SimpleFunction((SimpleFunction *)local_17d0,(SimpleFunction *)local_1c70);
  local_17d0[0] = (__hashtable_alloc *)pcVar35;
  duckdb::LogicalType::LogicalType(aLStack_1740,aLStack_1be0);
  aLStack_1740[0x18] = aLStack_1be0[0x18];
  aLStack_1740[0x19] = aLStack_1be0[0x19];
  aLStack_1740[0x1a] = aLStack_1be0[0x1a];
  aLStack_1740[0x1b] = aLStack_1be0[0x1b];
  local_17d0[0] = (__hashtable_alloc *)ppuVar34;
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &_Stack_1720,
             (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &_Stack_1bc0);
  puVar24 = auStack_1ba0;
  puVar25 = auStack_1700;
  for (lVar23 = 9; lVar23 != 0; lVar23 = lVar23 + -1) {
    *puVar25 = *puVar24;
    puVar24 = puVar24 + (ulong)bVar26 * -2 + 1;
    puVar25 = puVar25 + (ulong)bVar26 * -2 + 1;
  }
  local_16b8 = local_1b58;
  local_16b0 = local_1b50._M_pi;
  if (local_1b50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1b50._M_pi)->_M_use_count = (local_1b50._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1b50._M_pi)->_M_use_count = (local_1b50._M_pi)->_M_use_count + 1;
    }
  }
  SVar11._8_8_ = uVar38;
  SVar11._0_8_ = uVar40;
  SVar11._16_8_ = uVar27;
  SVar11._24_8_ = pLVar29;
  SVar11._32_4_ = uVar30;
  SVar11._36_4_ = in_stack_ffffffffffffd70c;
  SVar11._40_4_ = uVar31;
  SVar11._44_4_ = in_stack_ffffffffffffd714;
  SVar11._48_8_ = uVar32;
  SVar11._56_8_ = ppuVar34;
  SVar11._64_8_ = db;
  SVar11._72_8_ = pcVar35;
  SVar11._80_8_ = in_stack_ffffffffffffd738;
  SVar11._88_8_ = this._M_head_impl;
  SVar11._96_8_ = puVar36;
  SVar11._104_8_ = in_stack_ffffffffffffd750;
  SVar11._112_16_ = in_stack_ffffffffffffd758;
  SVar11._128_8_ = in_stack_ffffffffffffd768;
  SVar11._136_8_ = in_stack_ffffffffffffd770;
  SVar11._144_8_ = in_stack_ffffffffffffd778;
  SVar11._152_48_ = in_stack_ffffffffffffd780;
  SVar11.function._M_invoker = (_Invoker_type)lVar22;
  SVar11.bind = (bind_scalar_function_t)lVar21;
  SVar11.bind_extended = (bind_scalar_function_extended_t)lVar19;
  SVar11.init_local_state._0_1_ = in_stack_ffffffffffffd7c8;
  SVar11.init_local_state._1_1_ = in_stack_ffffffffffffd7c9;
  SVar11._226_46_ = in_stack_ffffffffffffd7ca;
  SVar11.deserialize = (function_deserialize_t)in_stack_ffffffffffffd7f8;
  SVar11.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_stack_ffffffffffffd800;
  SVar11.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_stack_ffffffffffffd808._M_pi;
  duckdb::ExtensionUtil::RegisterFunction(db,SVar11);
  local_17d0[0] = (__hashtable_alloc *)ppuVar34;
  if (local_16b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_16b0);
  }
  if (local_1710 != (code *)0x0) {
    (*local_1710)(&_Stack_1720,&_Stack_1720,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_17d0);
  BoundedType::Get((BoundedType *)local_2630,0xff);
  local_2358[0] = local_2348;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2358,"bounded_ascii","");
  duckdb::LogicalType::LogicalType
            ((LogicalType *)&stack0xffffffffffffd780,(LogicalType *)local_2630);
  __l_06._M_len = 1;
  __l_06._M_array = (iterator)&stack0xffffffffffffd780;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_2560,__l_06,(allocator_type *)&stack0xffffffffffffd7e0);
  duckdb::LogicalType::LogicalType(local_2578,VARCHAR);
  pcVar43 = std::
            _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
            ::_M_manager;
  pLVar29 = local_21e0;
  duckdb::LogicalType::LogicalType(pLVar29,INVALID);
  uVar32 = 0;
  uVar31 = 0;
  uVar30 = 0;
  uVar27 = 0;
  uVar40 = 0;
  uVar38 = 0;
  duckdb::ScalarFunction::ScalarFunction
            ((ScalarFunction *)local_1b48,local_2358,&local_2560,local_2578,&stack0xffffffffffffd818
             ,0);
  duckdb::LogicalType::~LogicalType(local_21e0);
  if (pcVar43 != (code *)0x0) {
    (*pcVar43)(&stack0xffffffffffffd818,&stack0xffffffffffffd818,3);
  }
  duckdb::LogicalType::~LogicalType(local_2578);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2560);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffd780);
  if (local_2358[0] != local_2348) {
    operator_delete(local_2358[0]);
  }
  duckdb::SimpleFunction::SimpleFunction((SimpleFunction *)local_18f8,(SimpleFunction *)local_1b48);
  local_18f8[0] = (__hashtable_alloc *)pcVar35;
  duckdb::LogicalType::LogicalType(local_1868,(LogicalType *)(local_1b48 + 0x90));
  local_1868[0x18] = (LogicalType)local_1b48[0xa8];
  local_1868[0x19] = (LogicalType)local_1b48[0xa9];
  local_1868[0x1a] = (LogicalType)local_1b48[0xaa];
  local_1868[0x1b] = (LogicalType)local_1b48[0xab];
  local_18f8[0] = (__hashtable_alloc *)ppuVar34;
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &local_1848,
             (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             &_Stack_1a98);
  puVar24 = auStack_1a78;
  puVar25 = auStack_1828;
  for (lVar23 = 9; lVar23 != 0; lVar23 = lVar23 + -1) {
    *puVar25 = *puVar24;
    puVar24 = puVar24 + (ulong)bVar26 * -2 + 1;
    puVar25 = puVar25 + (ulong)bVar26 * -2 + 1;
  }
  local_17e0 = local_1a30;
  local_17d8 = local_1a28._M_pi;
  if (local_1a28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1a28._M_pi)->_M_use_count = (local_1a28._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1a28._M_pi)->_M_use_count = (local_1a28._M_pi)->_M_use_count + 1;
    }
  }
  SVar12._8_8_ = uVar38;
  SVar12._0_8_ = uVar40;
  SVar12._16_8_ = uVar27;
  SVar12._24_8_ = pLVar29;
  SVar12._32_4_ = uVar30;
  SVar12._36_4_ = in_stack_ffffffffffffd70c;
  SVar12._40_4_ = uVar31;
  SVar12._44_4_ = in_stack_ffffffffffffd714;
  SVar12._48_8_ = uVar32;
  SVar12._56_8_ = ppuVar34;
  SVar12._64_8_ = db;
  SVar12._72_8_ = pcVar35;
  SVar12._80_8_ = in_stack_ffffffffffffd738;
  SVar12._88_8_ = this._M_head_impl;
  SVar12._96_8_ = puVar36;
  SVar12._104_8_ = in_stack_ffffffffffffd750;
  SVar12._112_16_ = in_stack_ffffffffffffd758;
  SVar12._128_8_ = in_stack_ffffffffffffd768;
  SVar12._136_8_ = in_stack_ffffffffffffd770;
  SVar12._144_8_ = in_stack_ffffffffffffd778;
  SVar12._152_48_ = in_stack_ffffffffffffd780;
  SVar12.function._M_invoker = (_Invoker_type)lVar22;
  SVar12.bind = (bind_scalar_function_t)lVar21;
  SVar12.bind_extended = (bind_scalar_function_extended_t)lVar19;
  SVar12.init_local_state._0_1_ = in_stack_ffffffffffffd7c8;
  SVar12.init_local_state._1_1_ = in_stack_ffffffffffffd7c9;
  SVar12._226_46_ = in_stack_ffffffffffffd7ca;
  SVar12.deserialize = (function_deserialize_t)in_stack_ffffffffffffd7f8;
  SVar12.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_stack_ffffffffffffd800;
  SVar12.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_stack_ffffffffffffd808._M_pi;
  duckdb::ExtensionUtil::RegisterFunction(db,SVar12);
  local_18f8[0] = (__hashtable_alloc *)ppuVar34;
  if (local_17d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_17d8);
  }
  if (local_1838 != (code *)0x0) {
    (*local_1838)(&local_1848,&local_1848,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_18f8);
  plVar39 = (long *)0x0;
  duckdb::BoundCastInfo::BoundCastInfo(local_2648,BoundedToBoundedCast,&stack0xffffffffffffd778,0);
  duckdb::ExtensionUtil::RegisterCastFunction(db,&stack0xffffffffffffd798,local_2630,local_2648,0);
  if (local_2638 != (long *)0x0) {
    (**(code **)(*local_2638 + 8))();
  }
  local_2638 = (long *)0x0;
  if (plVar39 != (long *)0x0) {
    (**(code **)(*plVar39 + 8))();
  }
  uVar40 = 0;
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffd780,INTEGER);
  plVar39 = (long *)0x0;
  duckdb::BoundCastInfo::BoundCastInfo(local_2660,IntToBoundedCast,&stack0xffffffffffffd770,0);
  duckdb::ExtensionUtil::RegisterCastFunction
            (db,&stack0xffffffffffffd780,&stack0xffffffffffffd798,local_2660,0);
  if (local_2650 != (long *)0x0) {
    (**(code **)(*local_2650 + 8))();
  }
  local_2650 = (long *)0x0;
  if (plVar39 != (long *)0x0) {
    (**(code **)(*plVar39 + 8))();
  }
  uVar38 = 0;
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffd780);
  MinMaxType::GetDefault();
  local_2378[0] = local_2368;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2378,"MINMAX","");
  duckdb::LogicalType::LogicalType(local_2590,(LogicalType *)&stack0xffffffffffffd780);
  duckdb::ExtensionUtil::RegisterType(db,local_2378,local_2590,MinMaxType::Bind);
  duckdb::LogicalType::~LogicalType(local_2590);
  if (local_2378[0] != local_2368) {
    operator_delete(local_2378[0]);
  }
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffd7e0,INTEGER);
  plVar39 = (long *)0x0;
  duckdb::BoundCastInfo::BoundCastInfo(local_2678,IntToMinMaxCast,&stack0xffffffffffffd768,0);
  duckdb::ExtensionUtil::RegisterCastFunction
            (db,&stack0xffffffffffffd7e0,&stack0xffffffffffffd780,local_2678,0);
  if (local_2668 != (long *)0x0) {
    (**(code **)(*local_2668 + 8))();
  }
  local_2668 = (long *)0x0;
  if (plVar39 != (long *)0x0) {
    (**(code **)(*plVar39 + 8))();
  }
  uVar37 = 0;
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffd7e0);
  local_2398[0] = local_2388;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2398,"minmax_range","");
  duckdb::LogicalType::LogicalType
            ((LogicalType *)&stack0xffffffffffffd7e0,(LogicalType *)&stack0xffffffffffffd780);
  __l_07._M_len = 1;
  __l_07._M_array = (iterator)&stack0xffffffffffffd7e0;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_25a8,__l_07,(allocator_type *)&stack0xffffffffffffd73f);
  duckdb::LogicalType::LogicalType(local_25c0,INTEGER);
  uVar41 = 0;
  pcVar43 = MinMaxRangeFunc;
  pcVar42 = std::
            _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
            ::_M_manager;
  pLVar29 = local_21f8;
  duckdb::LogicalType::LogicalType(pLVar29,INVALID);
  uVar33 = 0;
  uVar31 = 0;
  uVar30 = 0;
  uVar28 = 0;
  uVar27 = 0;
  uVar32 = 0;
  duckdb::ScalarFunction::ScalarFunction
            (&local_5f0,local_2398,&local_25a8,local_25c0,&stack0xffffffffffffd7f8,0);
  SVar13._8_8_ = uVar32;
  SVar13._0_8_ = uVar27;
  SVar13._16_8_ = uVar28;
  SVar13._24_8_ = pLVar29;
  SVar13._32_4_ = uVar30;
  SVar13._36_4_ = in_stack_ffffffffffffd70c;
  SVar13._40_4_ = uVar31;
  SVar13._44_4_ = in_stack_ffffffffffffd714;
  SVar13._48_8_ = uVar33;
  SVar13._56_8_ = ppuVar34;
  SVar13._64_8_ = db;
  SVar13._72_8_ = pcVar35;
  SVar13._80_8_ = in_stack_ffffffffffffd738;
  SVar13._88_8_ = this._M_head_impl;
  SVar13._96_8_ = puVar36;
  SVar13._104_8_ = in_stack_ffffffffffffd750;
  SVar13._112_16_ = in_stack_ffffffffffffd758;
  SVar13._128_8_ = uVar37;
  SVar13._136_8_ = uVar38;
  SVar13._144_8_ = uVar40;
  SVar13._152_48_ = in_stack_ffffffffffffd780;
  SVar13.function._M_invoker = (_Invoker_type)lVar22;
  SVar13.bind = (bind_scalar_function_t)lVar21;
  SVar13.bind_extended = (bind_scalar_function_extended_t)lVar19;
  SVar13.init_local_state._0_1_ = in_stack_ffffffffffffd7c8;
  SVar13.init_local_state._1_1_ = in_stack_ffffffffffffd7c9;
  SVar13._226_46_ = in_stack_ffffffffffffd7ca;
  SVar13.deserialize = pcVar43;
  SVar13.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar41;
  SVar13.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar42;
  duckdb::ExtensionUtil::RegisterFunction(db,SVar13);
  local_5f0._0_8_ = ppuVar34;
  if (local_5f0.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5f0.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_5f0.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_5f0.function.super__Function_base._M_manager)
              ((_Any_data *)((long)&local_5f0 + 0xb0U),(_Any_data *)((long)&local_5f0 + 0xb0U),
               __destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction(&local_5f0.super_BaseScalarFunction);
  duckdb::LogicalType::~LogicalType(local_21f8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar42 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*pcVar42)(&stack0xffffffffffffd7f8,&stack0xffffffffffffd7f8,3);
  }
  duckdb::LogicalType::~LogicalType(local_25c0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_25a8);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffd7e0);
  if (local_2398[0] != local_2388) {
    operator_delete(local_2398[0]);
  }
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffd780);
  local_1b48._0_8_ = ppuVar34;
  if (local_1a28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a28._M_pi);
  }
  if (local_1a88 != (_Manager_type)0x0) {
    (*local_1a88)(&_Stack_1a98,&_Stack_1a98,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_1b48);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_2630);
  local_1c70._0_8_ = ppuVar34;
  if (local_1b50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b50._M_pi);
  }
  if (local_1bb0 != (_Manager_type)0x0) {
    (*local_1bb0)(&_Stack_1bc0,&_Stack_1bc0,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_1c70);
  local_1a20._0_8_ = ppuVar34;
  if (local_1900._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1900._M_pi);
  }
  if (local_1960 != (_Manager_type)0x0) {
    (*local_1960)(&_Stack_1970,&_Stack_1970,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_1a20);
  local_1458._0_8_ = ppuVar34;
  if (local_1338._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1338._M_pi);
  }
  if (local_1398 != (_Manager_type)0x0) {
    (*local_1398)(local_26a8,local_26a8,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_1458);
  local_1d98._0_8_ = ppuVar34;
  if (local_1c78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c78._M_pi);
  }
  if (local_1cd8 != (_Manager_type)0x0) {
    (*local_1cd8)(local_26a0,local_26a0,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_1d98);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffd798);
  local_3a0[0] = (undefined **)duckdb::Catalog::GetSystemCatalog;
  std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector(local_200);
  if (local_220 != local_210) {
    operator_delete(local_220);
  }
  local_3a0[0] = &PTR__CreateFunctionInfo_00125b68;
  std::vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>::~vector
            (local_238);
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  ppuVar15 = local_2680;
  if (local_278 != local_268) {
    operator_delete(local_278);
  }
  duckdb::CreateInfo::~CreateInfo((CreateInfo *)local_3a0);
  local_7a8._0_8_ = ppuVar15;
  if (local_600._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_600._M_pi);
  }
  duckdb::SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_7a8);
  local_e90[0]._M_dataplus._M_p = (pointer)duckdb::StringUtil::Contains;
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector(local_cf0);
  if (local_d10 != local_d00) {
    operator_delete(local_d10);
  }
  local_e90[0]._M_dataplus._M_p = (pointer)&PTR__CreateFunctionInfo_00125b68;
  std::vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>::~vector
            (local_d28);
  if (local_d48 != local_d38) {
    operator_delete(local_d48);
  }
  if (local_d68 != local_d58) {
    operator_delete(local_d68);
  }
  duckdb::CreateInfo::~CreateInfo((CreateInfo *)local_e90);
  local_b20._0_8_ = ppuVar34;
  if (local_a00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a00._M_pi);
  }
  if (local_a60 != (_Manager_type)0x0) {
    (*local_a60)(local_2698,local_2698,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_b20);
  local_1f50._0_8_ = duckdb::StringUtil::Contains;
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector(local_1db0);
  if (local_1dd0 != local_1dc0) {
    operator_delete(local_1dd0);
  }
  local_1f50._0_8_ = &PTR__CreateFunctionInfo_00125b68;
  std::vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>::~vector
            (local_1de8);
  if (local_1e08 != local_1df8) {
    operator_delete(local_1e08);
  }
  if (local_1e28 != local_1e18) {
    operator_delete(local_1e28);
  }
  duckdb::CreateInfo::~CreateInfo((CreateInfo *)local_1f50);
  local_9f8._0_8_ = ppuVar34;
  if (local_8d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8d8._M_pi);
  }
  if (local_938 != (_Manager_type)0x0) {
    (*local_938)(local_2690,local_2690,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_9f8);
  local_2108._0_8_ = duckdb::StringUtil::Contains;
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector(local_1f68);
  if (local_1f88 != local_1f78) {
    operator_delete(local_1f88);
  }
  local_2108._0_8_ = &PTR__CreateFunctionInfo_00125b68;
  std::vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>::~vector
            (local_1fa0);
  if (local_1fc0 != local_1fb0) {
    operator_delete(local_1fc0);
  }
  if (local_1fe0 != local_1fd0) {
    operator_delete(local_1fe0);
  }
  duckdb::CreateInfo::~CreateInfo((CreateInfo *)local_2108);
  local_8d0._0_8_ = ppuVar34;
  if (local_7b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_7b0._M_pi);
  }
  if (local_810 != (_Manager_type)0x0) {
    (*local_810)(local_2688,local_2688,__destroy_functor);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_8d0);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffd7c8);
  if (this._M_head_impl != (CreateTypeInfo *)0x0) {
    (**(code **)(*(long *)this._M_head_impl + 8))();
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector(&local_26c8);
  if (puVar36 != &stack0xffffffffffffd758) {
    operator_delete(puVar36);
  }
  duckdb::Connection::~Connection(local_2618);
  local_1e8[0] = (undefined **)duckdb::StringUtil::Contains;
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector(local_48);
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  local_1e8[0] = &PTR__CreateFunctionInfo_00125b68;
  std::vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>::~vector
            (local_80);
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0);
  }
  duckdb::CreateInfo::~CreateInfo((CreateInfo *)local_1e8);
  return;
}

Assistant:

DUCKDB_EXTENSION_API void loadable_extension_demo_init(duckdb::DatabaseInstance &db) {
	CreateScalarFunctionInfo hello_alias_info(
	    ScalarFunction("test_alias_hello", {}, LogicalType::VARCHAR, TestAliasHello));

	// create a scalar function
	Connection con(db);
	auto &client_context = *con.context;
	auto &catalog = Catalog::GetSystemCatalog(client_context);
	con.BeginTransaction();
	con.CreateScalarFunction<int32_t, string_t>("hello", {LogicalType(LogicalTypeId::VARCHAR)},
	                                            LogicalType(LogicalTypeId::INTEGER), &hello_fun);
	catalog.CreateFunction(client_context, hello_alias_info);

	// Add alias POINT type
	string alias_name = "POINT";
	child_list_t<LogicalType> child_types;
	child_types.push_back(make_pair("x", LogicalType::INTEGER));
	child_types.push_back(make_pair("y", LogicalType::INTEGER));
	auto alias_info = make_uniq<CreateTypeInfo>();
	alias_info->internal = true;
	alias_info->name = alias_name;
	LogicalType target_type = LogicalType::STRUCT(child_types);
	target_type.SetAlias(alias_name);
	alias_info->type = target_type;

	auto type_entry = catalog.CreateType(client_context, *alias_info);
	type_entry->tags["ext:name"] = "loadable_extension_demo";
	type_entry->tags["ext:author"] = "DuckDB Labs";

	// Function add point
	ScalarFunction add_point_func("add_point", {target_type, target_type}, target_type, AddPointFunction);
	CreateScalarFunctionInfo add_point_info(add_point_func);
	auto add_point_entry = catalog.CreateFunction(client_context, add_point_info);
	add_point_entry->tags["ext:name"] = "loadable_extension_demo";
	add_point_entry->tags["ext:author"] = "DuckDB Labs";

	// Function sub point
	ScalarFunction sub_point_func("sub_point", {target_type, target_type}, target_type, SubPointFunction);
	CreateScalarFunctionInfo sub_point_info(sub_point_func);
	auto sub_point_entry = catalog.CreateFunction(client_context, sub_point_info);
	sub_point_entry->tags["ext:name"] = "loadable_extension_demo";
	sub_point_entry->tags["ext:author"] = "DuckDB Labs";

	// Function sub point
	ScalarFunction loaded_extensions("loaded_extensions", {}, LogicalType::VARCHAR, LoadedExtensionsFunction);
	CreateScalarFunctionInfo loaded_extensions_info(loaded_extensions);
	catalog.CreateFunction(client_context, loaded_extensions_info);

	// Quack function
	QuackFunction quack_function;
	CreateTableFunctionInfo quack_info(quack_function);
	catalog.CreateTableFunction(client_context, quack_info);

	con.Commit();

	// add a parser extension
	auto &config = DBConfig::GetConfig(db);
	config.parser_extensions.push_back(QuackExtension());
	config.extension_callbacks.push_back(make_uniq<QuackLoadExtension>());

	// Bounded type
	auto bounded_type = BoundedType::GetDefault();
	ExtensionUtil::RegisterType(db, "BOUNDED", bounded_type, BoundedType::Bind);

	// Example of function inspecting the type property
	ScalarFunction bounded_max("bounded_max", {bounded_type}, LogicalType::INTEGER, BoundedMaxFunc, BoundedMaxBind);
	ExtensionUtil::RegisterFunction(db, bounded_max);

	// Example of function inspecting the type property and returning the same type
	ScalarFunction bounded_invert("bounded_invert", {bounded_type}, bounded_type, BoundedInvertFunc, BoundedInvertBind);
	// bounded_invert.serialize = BoundedReturnSerialize;
	// bounded_invert.deserialize = BoundedReturnDeserialize;
	ExtensionUtil::RegisterFunction(db, bounded_invert);

	// Example of function inspecting the type property of both arguments and returning a new type
	ScalarFunction bounded_add("bounded_add", {bounded_type, bounded_type}, bounded_type, BoundedAddFunc,
	                           BoundedAddBind);
	ExtensionUtil::RegisterFunction(db, bounded_add);

	// Example of function that is generic over the type property (the bound is not important)
	ScalarFunction bounded_even("bounded_even", {bounded_type}, LogicalType::BOOLEAN, BoundedEvenFunc);
	ExtensionUtil::RegisterFunction(db, bounded_even);

	// Example of function that is specialized over type property
	auto bounded_specialized_type = BoundedType::Get(0xFF);
	ScalarFunction bounded_to_ascii("bounded_ascii", {bounded_specialized_type}, LogicalType::VARCHAR,
	                                BoundedToAsciiFunc);
	ExtensionUtil::RegisterFunction(db, bounded_to_ascii);

	// Enable explicit casting to our specialized type
	ExtensionUtil::RegisterCastFunction(db, bounded_type, bounded_specialized_type, BoundCastInfo(BoundedToBoundedCast),
	                                    0);
	// Casts
	ExtensionUtil::RegisterCastFunction(db, LogicalType::INTEGER, bounded_type, BoundCastInfo(IntToBoundedCast), 0);

	// MinMax Type
	auto minmax_type = MinMaxType::GetDefault();
	ExtensionUtil::RegisterType(db, "MINMAX", minmax_type, MinMaxType::Bind);
	ExtensionUtil::RegisterCastFunction(db, LogicalType::INTEGER, minmax_type, BoundCastInfo(IntToMinMaxCast), 0);
	ExtensionUtil::RegisterFunction(
	    db, ScalarFunction("minmax_range", {minmax_type}, LogicalType::INTEGER, MinMaxRangeFunc));
}